

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::TransformTimes(FormattingScene *this,Float start,Float end,FileLoc loc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  char *unaff_retaddr;
  string local_30 [20];
  int in_stack_ffffffffffffffe4;
  FormattingScene *in_stack_ffffffffffffffe8;
  
  indent_abi_cxx11_(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  Printf<std::__cxx11::string,float&,float&>
            (unaff_retaddr,in_RDI,(float *)CONCAT44(in_XMM0_Da,in_XMM1_Da),
             (float *)in_stack_ffffffffffffffe8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void FormattingScene::TransformTimes(Float start, Float end, FileLoc loc) {
    Printf("%sTransformTimes %f %f\n", indent(), start, end);
}